

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

void duckdb::DatePart::StructOperator::Operation<duckdb::timestamp_t>
               (bigint_vec *bigint_values,double_vec *double_values,timestamp_t *input,idx_t idx,
               part_mask_t mask)

{
  value_type pdVar1;
  reference ppdVar2;
  long lVar3;
  double dVar4;
  dtime_t t;
  date_t d;
  dtime_t local_70;
  date_t local_64;
  vector<double_*,_std::allocator<double_*>_> local_60;
  vector<double_*,_std::allocator<double_*>_> local_48;
  
  duckdb::Timestamp::Convert((timestamp_t)input->value,&local_64,&local_70);
  Operation<duckdb::date_t>(bigint_values,double_values,&local_64,idx,mask & 0xfffffffffffffff7);
  Operation<duckdb::dtime_t>(bigint_values,double_values,&local_70,idx,mask & 0xfffffffffffffff7);
  if ((mask & 8) != 0) {
    std::vector<double_*,_std::allocator<double_*>_>::vector
              (&local_48,&double_values->super_vector<double_*,_std::allocator<double_*>_>);
    ppdVar2 = vector<double_*,_true>::operator[]((vector<double_*,_true> *)&local_48,0);
    pdVar1 = *ppdVar2;
    if (local_48.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (pdVar1 != (value_type)0x0) {
      lVar3 = duckdb::Timestamp::GetEpochMicroSeconds((timestamp_t)input->value);
      pdVar1[idx] = (double)lVar3 / 1000000.0;
    }
  }
  if ((char)mask < '\0') {
    std::vector<double_*,_std::allocator<double_*>_>::vector
              (&local_60,&double_values->super_vector<double_*,_std::allocator<double_*>_>);
    ppdVar2 = vector<double_*,_true>::operator[]((vector<double_*,_true> *)&local_60,1);
    pdVar1 = *ppdVar2;
    if (local_60.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (pdVar1 != (value_type)0x0) {
      dVar4 = (double)duckdb::Timestamp::GetJulianDay((timestamp_t)input->value);
      pdVar1[idx] = dVar4;
    }
  }
  return;
}

Assistant:

void DatePart::StructOperator::Operation(bigint_vec &bigint_values, double_vec &double_values, const timestamp_t &input,
                                         const idx_t idx, const part_mask_t mask) {
	D_ASSERT(Timestamp::IsFinite(input));
	date_t d;
	dtime_t t;
	Timestamp::Convert(input, d, t);

	// Both define epoch, and the correct value is the sum.
	// So mask it out and compute it separately.
	Operation(bigint_values, double_values, d, idx, mask & ~UnsafeNumericCast<part_mask_t>(EPOCH));
	Operation(bigint_values, double_values, t, idx, mask & ~UnsafeNumericCast<part_mask_t>(EPOCH));

	if (mask & EPOCH) {
		auto part_data = HasPartValue(double_values, DatePartSpecifier::EPOCH);
		if (part_data) {
			part_data[idx] = EpochOperator::Operation<timestamp_t, double>(input);
		}
	}

	if (mask & JD) {
		auto part_data = HasPartValue(double_values, DatePartSpecifier::JULIAN_DAY);
		if (part_data) {
			part_data[idx] = JulianDayOperator::Operation<timestamp_t, double>(input);
		}
	}
}